

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPlaMo.c
# Opt level: O2

Vec_Int_t * Mop_ManFindDist1Pairs(Mop_Man_t *p,Vec_Int_t *vGroup)

{
  int i;
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  word *pCube1;
  word *pwVar3;
  word *__s2;
  int i_00;
  int i_01;
  
  p_00 = Vec_IntAlloc(100);
  iVar1 = vGroup->nSize;
  iVar2 = 0;
  while (i_00 = iVar2, i_00 < iVar1) {
    i = Vec_IntEntry(vGroup,i_00);
    pCube1 = Mop_ManCubeIn(p,i);
    for (i_01 = i_00 + 1; iVar1 = vGroup->nSize, iVar2 = i_00 + 1, i_01 < iVar1; i_01 = i_01 + 1) {
      iVar1 = Vec_IntEntry(vGroup,i_01);
      pwVar3 = Mop_ManCubeIn(p,iVar1);
      iVar2 = Mop_ManCheckDist1(pCube1,pwVar3,p->nWordsIn);
      if (iVar2 != 0) {
        pwVar3 = Mop_ManCubeOut(p,i);
        __s2 = Mop_ManCubeOut(p,iVar1);
        iVar1 = bcmp(pwVar3,__s2,(long)p->nWordsOut << 3);
        if (iVar1 == 0) {
          Vec_IntPushTwo(p_00,i_00,i_01);
        }
      }
    }
  }
  return p_00;
}

Assistant:

Vec_Int_t * Mop_ManFindDist1Pairs( Mop_Man_t * p, Vec_Int_t * vGroup )
{
    int c1, c2, iCube1, iCube2;
    Vec_Int_t * vPairs = Vec_IntAlloc( 100 );
    Vec_IntForEachEntry( vGroup, iCube1, c1 )
    {
        word * pCube1Out, * pCube1 = Mop_ManCubeIn( p, iCube1 );
        Vec_IntForEachEntryStart( vGroup, iCube2, c2, c1+1 )
        {
            word * pCube2Out, * pCube2 = Mop_ManCubeIn( p, iCube2 );
            if ( !Mop_ManCheckDist1(pCube1, pCube2, p->nWordsIn) )
                continue;
            pCube1Out = Mop_ManCubeOut( p, iCube1 );
            pCube2Out = Mop_ManCubeOut( p, iCube2 );
            if ( !memcmp(pCube1Out, pCube2Out, sizeof(word)*p->nWordsOut) )
                Vec_IntPushTwo( vPairs, c1, c2 );
        }
    }
    return vPairs;
}